

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageCompareTests.cpp
# Opt level: O1

void __thiscall
dit::BilinearCompareCase::BilinearCompareCase
          (BilinearCompareCase *this,TestContext *testCtx,char *name,char *refImg,char *cmpImg,
          RGBA *threshold,bool expectedResult)

{
  allocator<char> local_22;
  allocator<char> local_21;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,"");
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BilinearCompareCase_00273c80;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_refImg,refImg,&local_21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_cmpImg,cmpImg,&local_22);
  (this->m_threshold).m_value = threshold->m_value;
  this->m_expectedResult = expectedResult;
  return;
}

Assistant:

BilinearCompareCase (tcu::TestContext& testCtx, const char* name, const char* refImg, const char* cmpImg, const tcu::RGBA& threshold, bool expectedResult)
		: tcu::TestCase		(testCtx, name, "")
		, m_refImg			(refImg)
		, m_cmpImg			(cmpImg)
		, m_threshold		(threshold)
		, m_expectedResult	(expectedResult)
	{
	}